

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

PackageSymbol * __thiscall
slang::ast::Compilation::createPackage
          (Compilation *this,Scope *scope,ModuleDeclarationSyntax *syntax)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *this_00;
  bool bVar9;
  NetType *defaultNetType;
  uint64_t hash;
  Diagnostic *this_01;
  ulong uVar10;
  ulong uVar11;
  value_type_pointer __y;
  byte bVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  string_view *sv;
  value_type_pointer ppVar18;
  PackageSymbol *pPVar19;
  uchar uVar20;
  uchar uVar22;
  uchar uVar23;
  byte bVar24;
  undefined1 auVar21 [16];
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  byte bVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  byte bVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  undefined1 auVar25 [16];
  byte bVar37;
  SourceRange sourceRange;
  try_emplace_args_t local_d9;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *local_d8;
  PackageSymbol *local_d0;
  Scope *local_c8;
  PackageSymbol *local_c0;
  ModuleDeclarationSyntax *local_b8;
  Compilation *local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  uint64_t local_88;
  locator local_80;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  local_d8 = (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
             &this->syntaxMetadata;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = syntax;
  uVar14 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar10 = uVar14 >> ((byte)(this->syntaxMetadata).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                            .arrays.groups_size_index & 0x3f);
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar14 & 0xff];
  ppVar18 = (this->syntaxMetadata).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
            .arrays.elements_;
  uVar11 = (this->syntaxMetadata).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
           .arrays.groups_size_mask;
  uVar13 = 0;
  uVar16 = uVar10;
  do {
    pgVar1 = (this->syntaxMetadata).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
             .arrays.groups_ + uVar16;
    local_48 = pgVar1->m[0].n;
    uStack_47 = pgVar1->m[1].n;
    uStack_46 = pgVar1->m[2].n;
    bStack_45 = pgVar1->m[3].n;
    uStack_44 = pgVar1->m[4].n;
    uStack_43 = pgVar1->m[5].n;
    uStack_42 = pgVar1->m[6].n;
    bStack_41 = pgVar1->m[7].n;
    uStack_40 = pgVar1->m[8].n;
    uStack_3f = pgVar1->m[9].n;
    uStack_3e = pgVar1->m[10].n;
    bStack_3d = pgVar1->m[0xb].n;
    uStack_3c = pgVar1->m[0xc].n;
    uStack_3b = pgVar1->m[0xd].n;
    uStack_3a = pgVar1->m[0xe].n;
    bStack_39 = pgVar1->m[0xf].n;
    uVar20 = (uchar)uVar3;
    auVar25[0] = -(local_48 == uVar20);
    uVar22 = (uchar)((uint)uVar3 >> 8);
    auVar25[1] = -(uStack_47 == uVar22);
    uVar23 = (uchar)((uint)uVar3 >> 0x10);
    auVar25[2] = -(uStack_46 == uVar23);
    bVar24 = (byte)((uint)uVar3 >> 0x18);
    auVar25[3] = -(bStack_45 == bVar24);
    auVar25[4] = -(uStack_44 == uVar20);
    auVar25[5] = -(uStack_43 == uVar22);
    auVar25[6] = -(uStack_42 == uVar23);
    auVar25[7] = -(bStack_41 == bVar24);
    auVar25[8] = -(uStack_40 == uVar20);
    auVar25[9] = -(uStack_3f == uVar22);
    auVar25[10] = -(uStack_3e == uVar23);
    auVar25[0xb] = -(bStack_3d == bVar24);
    auVar25[0xc] = -(uStack_3c == uVar20);
    auVar25[0xd] = -(uStack_3b == uVar22);
    auVar25[0xe] = -(uStack_3a == uVar23);
    auVar25[0xf] = -(bStack_39 == bVar24);
    for (uVar17 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe);
        local_d0 = (PackageSymbol *)syntax, local_b8 = syntax, uVar17 != 0;
        uVar17 = uVar17 - 1 & uVar17) {
      uVar6 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      if ((ModuleDeclarationSyntax *)ppVar18[uVar16 * 0xf + (ulong)uVar6].first == syntax) {
        ppVar18 = ppVar18 + uVar16 * 0xf + (ulong)uVar6;
        goto LAB_0026623a;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar14 & 7] & bStack_39) == 0) break;
    lVar15 = uVar16 + uVar13;
    uVar13 = uVar13 + 1;
    uVar16 = lVar15 + 1U & uVar11;
  } while (uVar13 <= uVar11);
  if ((this->syntaxMetadata).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
      .size_ctrl.size <
      (this->syntaxMetadata).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
              (&local_80,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
                *)local_d8,uVar10,uVar14,&local_d9,(SyntaxNode **)&local_d0);
    ppVar18 = local_80.p;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
              (&local_80,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
                *)local_d8,uVar14,&local_d9,(SyntaxNode **)&local_d0);
    ppVar18 = local_80.p;
  }
LAB_0026623a:
  defaultNetType = (ppVar18->second).defaultNetType;
  if (defaultNetType == (NetType *)0x0) {
    defaultNetType = Scope::getDefaultNetType(scope);
    (ppVar18->second).defaultNetType = defaultNetType;
  }
  local_d0 = PackageSymbol::fromSyntax
                       (scope,local_b8,defaultNetType,
                        (optional<slang::TimeScale>)
                        ((uint5)*(uint *)&(ppVar18->second).timeScale.
                                          super__Optional_base<slang::TimeScale,_true,_true>.
                                          _M_payload.super__Optional_payload_base<slang::TimeScale>.
                                          _M_engaged << 0x20 |
                        (uint5)(uint)(ppVar18->second).timeScale.
                                     super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                                     super__Optional_payload_base<slang::TimeScale>._M_payload));
  local_d8 = (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)&this->packageMap;
  sv = &(local_d0->super_Symbol).name;
  local_c0 = local_d0;
  hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                   ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)local_d8,sv
                   );
  this_00 = local_d8;
  uVar11 = hash >> ((byte)(this->packageMap).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
                          .arrays.groups_size_index & 0x3f);
  lVar15 = (hash & 0xff) * 4;
  uVar20 = (&UNK_0040c7ac)[lVar15];
  uVar22 = (&UNK_0040c7ad)[lVar15];
  uVar23 = (&UNK_0040c7ae)[lVar15];
  bVar24 = (&UNK_0040c7af)[lVar15];
  uVar16 = (ulong)((uint)hash & 7);
  uVar10 = 0;
  uVar13 = uVar11;
  uVar26 = uVar20;
  uVar27 = uVar22;
  uVar28 = uVar23;
  bVar29 = bVar24;
  uVar30 = uVar20;
  uVar31 = uVar22;
  uVar32 = uVar23;
  bVar33 = bVar24;
  uVar34 = uVar20;
  uVar35 = uVar22;
  uVar36 = uVar23;
  bVar37 = bVar24;
  do {
    pgVar4 = (this->packageMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
             .arrays.groups_;
    pgVar2 = pgVar4 + uVar13;
    local_58 = pgVar2->m[0].n;
    uStack_57 = pgVar2->m[1].n;
    uStack_56 = pgVar2->m[2].n;
    bStack_55 = pgVar2->m[3].n;
    uStack_54 = pgVar2->m[4].n;
    uStack_53 = pgVar2->m[5].n;
    uStack_52 = pgVar2->m[6].n;
    bStack_51 = pgVar2->m[7].n;
    uStack_50 = pgVar2->m[8].n;
    uStack_4f = pgVar2->m[9].n;
    uStack_4e = pgVar2->m[10].n;
    bStack_4d = pgVar2->m[0xb].n;
    uStack_4c = pgVar2->m[0xc].n;
    uStack_4b = pgVar2->m[0xd].n;
    uStack_4a = pgVar2->m[0xe].n;
    bVar12 = pgVar2->m[0xf].n;
    auVar21[0] = -(local_58 == uVar20);
    auVar21[1] = -(uStack_57 == uVar22);
    auVar21[2] = -(uStack_56 == uVar23);
    auVar21[3] = -(bStack_55 == bVar24);
    auVar21[4] = -(uStack_54 == uVar26);
    auVar21[5] = -(uStack_53 == uVar27);
    auVar21[6] = -(uStack_52 == uVar28);
    auVar21[7] = -(bStack_51 == bVar29);
    auVar21[8] = -(uStack_50 == uVar30);
    auVar21[9] = -(uStack_4f == uVar31);
    auVar21[10] = -(uStack_4e == uVar32);
    auVar21[0xb] = -(bStack_4d == bVar33);
    auVar21[0xc] = -(uStack_4c == uVar34);
    auVar21[0xd] = -(uStack_4b == uVar35);
    auVar21[0xe] = -(uStack_4a == uVar36);
    auVar21[0xf] = -(bVar12 == bVar37);
    uVar17 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe);
    bStack_49 = bVar12;
    if (uVar17 != 0) {
      ppVar5 = (this->packageMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
               .arrays.elements_;
      local_c8 = scope;
      local_b0 = this;
      local_a8 = uVar11;
      local_a0 = uVar13;
      local_98 = uVar10;
      local_90 = uVar16;
      local_88 = hash;
      local_68 = uVar20;
      uStack_67 = uVar22;
      uStack_66 = uVar23;
      bStack_65 = bVar24;
      uStack_64 = uVar26;
      uStack_63 = uVar27;
      uStack_62 = uVar28;
      bStack_61 = bVar29;
      uStack_60 = uVar30;
      uStack_5f = uVar31;
      uStack_5e = uVar32;
      bStack_5d = bVar33;
      uStack_5c = uVar34;
      uStack_5b = uVar35;
      uStack_5a = uVar36;
      bStack_59 = bVar37;
      do {
        uVar6 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        __y = ppVar5 + uVar13 * 0xf + (ulong)uVar6;
        bVar9 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          (this_00,sv,&__y->first);
        this = local_b0;
        pPVar19 = local_c0;
        if (bVar9) {
          if ((sv->_M_len != 0) && (local_c8->thisSym->kind == CompilationUnit)) {
            this_01 = Scope::addDiag(local_c8,(DiagCode)0x2a000a,(local_c0->super_Symbol).location);
            Diagnostic::operator<<(this_01,(pPVar19->super_Symbol).name);
            Diagnostic::addNote(this_01,(DiagCode)0xa0001,(__y->second->super_Symbol).location);
          }
          goto LAB_00266464;
        }
        uVar17 = uVar17 - 1 & uVar17;
      } while (uVar17 != 0);
      bVar12 = pgVar4[uVar13].m[0xf].n;
      hash = local_88;
      uVar11 = local_a8;
      scope = local_c8;
      uVar16 = local_90;
      uVar10 = local_98;
      uVar13 = local_a0;
      uVar20 = local_68;
      uVar22 = uStack_67;
      uVar23 = uStack_66;
      bVar24 = bStack_65;
      uVar26 = uStack_64;
      uVar27 = uStack_63;
      uVar28 = uStack_62;
      bVar29 = bStack_61;
      uVar30 = uStack_60;
      uVar31 = uStack_5f;
      uVar32 = uStack_5e;
      bVar33 = bStack_5d;
      uVar34 = uStack_5c;
      uVar35 = uStack_5b;
      uVar36 = uStack_5a;
      bVar37 = bStack_59;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[uVar16] & bVar12) == 0) break;
    uVar14 = (this->packageMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
             .arrays.groups_size_mask;
    lVar15 = uVar13 + uVar10;
    uVar10 = uVar10 + 1;
    uVar13 = lVar15 + 1U & uVar14;
  } while (uVar10 <= uVar14);
  if ((this->packageMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
      .size_ctrl.size <
      (this->packageMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ast::PackageSymbol*>
              ((locator *)&local_80,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
                *)local_d8,uVar11,hash,&local_d9,sv,&local_d0);
    pPVar19 = local_c0;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ast::PackageSymbol*>
              ((locator *)&local_80,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
                *)local_d8,hash,&local_d9,sv,&local_d0);
    pPVar19 = local_c0;
  }
LAB_00266464:
  uVar8 = *(undefined8 *)&pPVar19->timeScale;
  sourceRange = parsing::Token::range(&((local_b8->header).ptr)->name);
  checkElemTimeScale(this,(_Optional_base<slang::TimeScale,_true,_true>)SUB85(uVar8,0),sourceRange);
  return pPVar19;
}

Assistant:

const PackageSymbol& Compilation::createPackage(const Scope& scope,
                                                const ModuleDeclarationSyntax& syntax) {
    SLANG_ASSERT(!isFrozen());

    auto& metadata = syntaxMetadata[&syntax];
    if (!metadata.defaultNetType)
        metadata.defaultNetType = &scope.getDefaultNetType();

    auto& package = PackageSymbol::fromSyntax(scope, syntax, *metadata.defaultNetType,
                                              metadata.timeScale);

    auto [it, inserted] = packageMap.emplace(package.name, &package);
    if (!inserted && !package.name.empty() &&
        scope.asSymbol().kind == SymbolKind::CompilationUnit) {
        auto& diag = scope.addDiag(diag::Redefinition, package.location);
        diag << package.name;
        diag.addNote(diag::NotePreviousDefinition, it->second->location);
    }

    checkElemTimeScale(package.timeScale, syntax.header->name.range());

    return package;
}